

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O1

QList<int> * __thiscall
QPlatformPrintDevice::supportedResolutions
          (QList<int> *__return_storage_ptr__,QPlatformPrintDevice *this)

{
  Data *pDVar1;
  
  if (this->m_haveResolutions == false) {
    (*this->_vptr_QPlatformPrintDevice[0x27])(this);
  }
  pDVar1 = (this->m_resolutions).d.d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (this->m_resolutions).d.ptr;
  (__return_storage_ptr__->d).size = (this->m_resolutions).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<int> QPlatformPrintDevice::supportedResolutions() const
{
    if (!m_haveResolutions)
        loadResolutions();
    return m_resolutions;
}